

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O3

ze_result_t driver::zesDeviceEccAvailable(zes_device_handle_t hDevice,ze_bool_t *pAvailable)

{
  ze_result_t zVar1;
  
  if (DAT_0010ea28 != (code *)0x0) {
    zVar1 = (*DAT_0010ea28)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceEccAvailable(
        zes_device_handle_t hDevice,                    ///< [in] Handle for the component.
        ze_bool_t* pAvailable                           ///< [out] ECC functionality is available (true)/unavailable (false).
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnEccAvailable = context.zesDdiTable.Device.pfnEccAvailable;
        if( nullptr != pfnEccAvailable )
        {
            result = pfnEccAvailable( hDevice, pAvailable );
        }
        else
        {
            // generic implementation
        }

        return result;
    }